

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O2

int __thiscall icu_63::CharString::truncate(CharString *this,char *__file,__off_t __length)

{
  uint uVar1;
  
  uVar1 = 0;
  if (0 < (int)(uint)__file) {
    uVar1 = (uint)__file;
  }
  if ((int)uVar1 < this->len) {
    this->len = uVar1;
    (this->buffer).ptr[uVar1] = '\0';
  }
  return (int)this;
}

Assistant:

CharString &CharString::truncate(int32_t newLength) {
    if(newLength<0) {
        newLength=0;
    }
    if(newLength<len) {
        buffer[len=newLength]=0;
    }
    return *this;
}